

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O3

bool __thiscall cs::token_arglist::dump(token_arglist *this,ostream *o)

{
  _Elt_pointer ptVar1;
  _Map_pointer pptVar2;
  tree_type<cs::token_base_*> *tree;
  _Elt_pointer ptVar3;
  _Elt_pointer ptVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>(o,"< ArgumentList = {",0x12);
  ptVar3 = (this->mTreeList).
           super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  ptVar1 = (this->mTreeList).
           super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ptVar3 != ptVar1) {
    ptVar4 = (this->mTreeList).
             super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
    pptVar2 = (this->mTreeList).
              super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(o,"< ChildExpression: ",0x13);
      compiler_type::dump_expr(ptVar3->mRoot,o);
      std::__ostream_insert<char,std::char_traits<char>>(o," >",2);
      ptVar3 = ptVar3 + 1;
      if (ptVar3 == ptVar4) {
        ptVar3 = pptVar2[1];
        pptVar2 = pptVar2 + 1;
        ptVar4 = ptVar3 + 0x40;
      }
    } while (ptVar3 != ptVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,"} >",3);
  return true;
}

Assistant:

bool token_arglist::dump(std::ostream &o) const
	{
		o << "< ArgumentList = {";
		for (auto &tree: mTreeList) {
			o << "< ChildExpression: ";
			compiler_type::dump_expr(tree.root(), o);
			o << " >";
		}
		o << "} >";
		return true;
	}